

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

int __thiscall
TadsHttpServerThread::read_to_nl
          (TadsHttpServerThread *this,StringRef *dst,long ofs,int init_state,int end_state)

{
  char *pcVar1;
  TadsServerThread *this_00;
  ssize_t l;
  int in_ECX;
  long in_RDX;
  StringRef *in_RSI;
  TadsServerThread *in_RDI;
  int in_R8D;
  long len;
  long endofs;
  char *p;
  char buf [8192];
  int nlstate;
  undefined1 local_2038 [8204];
  int local_2c;
  int local_28;
  long local_20;
  StringRef *local_18;
  
  local_2c = in_ECX;
  local_28 = in_R8D;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    pcVar1 = StringRef::get(local_18);
    this_00 = (TadsServerThread *)(pcVar1 + local_20);
    pcVar1 = (char *)StringRef::getlen(local_18);
    for (; local_20 < (long)pcVar1 && local_2c != local_28; local_20 = local_20 + 1) {
      if ((local_2c == 2) &&
         (*(char *)&(this_00->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj.
                    _vptr_CVmRefCntObj == '\r')) {
        local_2c = 3;
      }
      else if (*(char *)&(this_00->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj.
                         _vptr_CVmRefCntObj == '\r') {
        local_2c = 1;
      }
      else if (((local_2c == 1) || (local_2c == 3)) &&
              (*(char *)&(this_00->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj.
                         _vptr_CVmRefCntObj == '\n')) {
        local_2c = local_2c + 1;
      }
      else {
        local_2c = 0;
      }
      this_00 = (TadsServerThread *)
                ((long)&(this_00->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj.
                        _vptr_CVmRefCntObj + 1);
    }
    if (local_2c == local_28) break;
    l = TadsServerThread::read(in_RDI,(int)local_2038,(void *)0x2000,1);
    TadsServerThread::set_run_state(this_00,pcVar1);
    if (l < 0) {
      return -1;
    }
    StringRef::append((StringRef *)this_00,pcVar1,l);
  }
  return (int)local_20;
}

Assistant:

int TadsHttpServerThread::read_to_nl(StringRef *dst, long ofs,
                                     int init_state, int end_state)
{
    /* newline state: 0 \r -> 1 \n -> 2 \r -> 3 \n -> 4 */
    int nlstate = init_state;

    /* keep going until we find the newline or newline pair */
    for (;;)
    {
        char buf[8192];

        /* scan up to the ending offset */
        const char *p = dst->get() + ofs;
        long endofs = dst->getlen();
        for ( ; ofs < endofs && nlstate != end_state ; ++ofs, ++p)
        {
            if (nlstate == 2 && *p == '\r')
                nlstate = 3;
            else if (*p == '\r')
                nlstate = 1;
            else if ((nlstate == 1 || nlstate == 3) && *p == '\n')
                nlstate += 1;
            else
                nlstate = 0;
        }

        /* if we're in the end state, we're done */
        if (nlstate == end_state)
            break;

        /* 
         *   We didn't find the end sequence, so we need more input.  Read at
         *   least one byte with no timeout, so that we block until
         *   something's available and then read all available bytes.  
         */
        long len = read(buf, sizeof(buf), 1, OS_FOREVER);
        set_run_state("Processing request");

        /* if we got the 'quit' signal, stop now */
        if (len < 0)
            return -1;

        /* append the text to the buffer */
        dst->append(buf, len);
    }

    /* return the buffer offset of the end of the terminating newline */
    return ofs;
}